

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_trainFromBuffer_fastCover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_fastCover_params_t parameters)

{
  ZDICT_cover_params_t parameters_00;
  ZDICT_fastCover_params_t fastCoverParams;
  FASTCOVER_accel_t accelParams_00;
  ZDICT_cover_params_t parameters_01;
  int iVar1;
  uint uVar2;
  void *__ptr;
  ulong in_RSI;
  int in_R8D;
  undefined8 in_stack_00000008;
  uint in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined8 in_stack_00000018;
  undefined8 uStack0000000000000020;
  uint in_stack_00000028;
  undefined4 in_stack_0000002c;
  undefined8 in_stack_00000030;
  int in_stack_00000038;
  undefined4 in_stack_0000003c;
  size_t dictionarySize;
  void *in_stack_00000058;
  uint nbFinalizeSamples;
  size_t tail;
  U16 *segmentFreqs;
  size_t initVal;
  FASTCOVER_accel_t accelParams;
  ZDICT_cover_params_t coverParams;
  FASTCOVER_ctx_t ctx;
  BYTE *dict;
  int displayLevel;
  undefined4 uVar3;
  undefined4 uVar4;
  uint local_f8;
  uint local_f4;
  undefined8 in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff38;
  size_t *in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  FASTCOVER_ctx_t *in_stack_ffffffffffffff58;
  U16 *in_stack_ffffffffffffff60;
  U16 *segmentFreqs_00;
  size_t in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  U32 *in_stack_ffffffffffffff78;
  FASTCOVER_ctx_t *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 auVar5 [12];
  undefined1 in_stack_ffffffffffffffa0 [32];
  size_t local_8;
  
  uVar2 = (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  g_displayLevel = in_stack_00000038;
  uStack0000000000000020 = 0x3ff0000000000000;
  if (in_stack_00000010 == 0) {
    local_f4 = 0x14;
  }
  else {
    local_f4 = in_stack_00000010;
  }
  if (in_stack_00000028 == 0) {
    local_f8 = 1;
  }
  else {
    local_f8 = in_stack_00000028;
  }
  memset(&stack0xffffffffffffff48,0,0x30);
  fastCoverParams.zParams.dictID = in_stack_0000003c;
  fastCoverParams.zParams.notificationLevel = in_stack_00000038;
  fastCoverParams.f = local_f4;
  fastCoverParams._0_8_ = in_stack_00000008;
  fastCoverParams.shrinkDict = in_stack_0000002c;
  fastCoverParams.accel = local_f8;
  fastCoverParams.steps = in_stack_00000014;
  fastCoverParams.nbThreads = (int)in_stack_00000018;
  fastCoverParams._20_4_ = (int)((ulong)in_stack_00000018 >> 0x20);
  fastCoverParams.splitPoint = (double)uStack0000000000000020;
  fastCoverParams._40_8_ = in_stack_00000030;
  FASTCOVER_convertToCoverParams(fastCoverParams,(ZDICT_cover_params_t *)&stack0xffffffffffffff48);
  parameters_00._44_4_ = in_stack_ffffffffffffff74;
  parameters_00.zParams.dictID = in_stack_ffffffffffffff70;
  uVar3 = SUB84(in_stack_ffffffffffffff58,0);
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  displayLevel = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  parameters_00.steps = (int)in_stack_ffffffffffffff50;
  parameters_00._0_8_ = in_stack_ffffffffffffff48;
  parameters_00.nbThreads = displayLevel;
  parameters_00.splitPoint._0_4_ = uVar3;
  parameters_00.splitPoint._4_4_ = uVar4;
  parameters_00._24_8_ = in_stack_ffffffffffffff60;
  parameters_00.zParams.compressionLevel = (int)in_stack_ffffffffffffff68;
  parameters_00.zParams.notificationLevel = (int)(in_stack_ffffffffffffff68 >> 0x20);
  segmentFreqs_00 = in_stack_ffffffffffffff60;
  iVar1 = FASTCOVER_checkParameters(parameters_00,in_RSI,local_f4,local_f8);
  if (iVar1 == 0) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"FASTCOVER parameters incorrect\n");
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffd6;
  }
  else if (in_R8D == 0) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"FASTCOVER must have at least one input file\n");
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffb8;
  }
  else if (in_RSI < 0x100) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"dictBufferCapacity must be at least %u\n",0x100);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffba;
  }
  else {
    accelParams_00.skip = in_stack_ffffffffffffff74;
    accelParams_00.finalize = in_stack_ffffffffffffff70;
    local_8 = FASTCOVER_ctx_init(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                 in_stack_ffffffffffffff48,
                                 FASTCOVER_defaultAccelParameters[local_f8].skip,
                                 FASTCOVER_defaultAccelParameters[local_f8].finalize,
                                 in_stack_ffffffffffffff38,uVar2,accelParams_00);
    uVar2 = ZSTD_isError(0x295c15);
    if (uVar2 == 0) {
      COVER_warnOnSmallCorpus((size_t)in_stack_ffffffffffffff60,CONCAT44(uVar4,uVar3),displayLevel);
      if (1 < g_displayLevel) {
        fprintf(_stderr,"Building dictionary\n");
        fflush(_stderr);
      }
      __ptr = calloc(1L << ((byte)local_f4 & 0x3f),2);
      parameters_01.steps = (int)in_stack_ffffffffffffff98;
      parameters_01.nbThreads = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      parameters_01.k = (int)in_stack_ffffffffffffff90;
      parameters_01.d = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      auVar5 = in_stack_ffffffffffffffa0._16_12_;
      parameters_01.splitPoint = (double)in_stack_ffffffffffffffa0._0_8_;
      parameters_01.shrinkDict = in_stack_ffffffffffffffa0._8_4_;
      parameters_01.shrinkDictMaxRegression = in_stack_ffffffffffffffa0._12_4_;
      parameters_01.zParams.compressionLevel = auVar5._0_4_;
      parameters_01.zParams.notificationLevel = auVar5._4_4_;
      parameters_01.zParams.dictID = auVar5._8_4_;
      parameters_01._44_4_ = in_stack_ffffffffffffffa0._28_4_;
      FASTCOVER_buildDictionary
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,parameters_01,segmentFreqs_00);
      local_8 = ZDICT_finalizeDictionary
                          ((void *)accelParams,initVal,segmentFreqs,tail,in_stack_00000058,
                           (size_t *)dictionarySize,coverParams.splitPoint._0_4_,
                           (ZDICT_params_t)coverParams._24_12_);
      uVar2 = ZSTD_isError(0x295db0);
      if ((uVar2 == 0) && (1 < g_displayLevel)) {
        fprintf(_stderr,"Constructed dictionary of size %u\n",local_8 & 0xffffffff);
        fflush(_stderr);
      }
      FASTCOVER_ctx_destroy((FASTCOVER_ctx_t *)0x295dfb);
      free(__ptr);
    }
    else if (0 < g_displayLevel) {
      fprintf(_stderr,"Failed to initialize context\n");
      fflush(_stderr);
    }
  }
  return local_8;
}

Assistant:

ZDICTLIB_API size_t
ZDICT_trainFromBuffer_fastCover(void* dictBuffer, size_t dictBufferCapacity,
                                const void* samplesBuffer,
                                const size_t* samplesSizes, unsigned nbSamples,
                                ZDICT_fastCover_params_t parameters)
{
    BYTE* const dict = (BYTE*)dictBuffer;
    FASTCOVER_ctx_t ctx;
    ZDICT_cover_params_t coverParams;
    FASTCOVER_accel_t accelParams;
    /* Initialize global data */
    g_displayLevel = (int)parameters.zParams.notificationLevel;
    /* Assign splitPoint and f if not provided */
    parameters.splitPoint = 1.0;
    parameters.f = parameters.f == 0 ? DEFAULT_F : parameters.f;
    parameters.accel = parameters.accel == 0 ? DEFAULT_ACCEL : parameters.accel;
    /* Convert to cover parameter */
    memset(&coverParams, 0 , sizeof(coverParams));
    FASTCOVER_convertToCoverParams(parameters, &coverParams);
    /* Checks */
    if (!FASTCOVER_checkParameters(coverParams, dictBufferCapacity, parameters.f,
                                   parameters.accel)) {
      DISPLAYLEVEL(1, "FASTCOVER parameters incorrect\n");
      return ERROR(parameter_outOfBound);
    }
    if (nbSamples == 0) {
      DISPLAYLEVEL(1, "FASTCOVER must have at least one input file\n");
      return ERROR(srcSize_wrong);
    }
    if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
      DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                   ZDICT_DICTSIZE_MIN);
      return ERROR(dstSize_tooSmall);
    }
    /* Assign corresponding FASTCOVER_accel_t to accelParams*/
    accelParams = FASTCOVER_defaultAccelParameters[parameters.accel];
    /* Initialize context */
    {
      size_t const initVal = FASTCOVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples,
                            coverParams.d, parameters.splitPoint, parameters.f,
                            accelParams);
      if (ZSTD_isError(initVal)) {
        DISPLAYLEVEL(1, "Failed to initialize context\n");
        return initVal;
      }
    }
    COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.nbDmers, g_displayLevel);
    /* Build the dictionary */
    DISPLAYLEVEL(2, "Building dictionary\n");
    {
      /* Initialize array to keep track of frequency of dmer within activeSegment */
      U16* segmentFreqs = (U16 *)calloc(((U64)1 << parameters.f), sizeof(U16));
      const size_t tail = FASTCOVER_buildDictionary(&ctx, ctx.freqs, dictBuffer,
                                                dictBufferCapacity, coverParams, segmentFreqs);
      const unsigned nbFinalizeSamples = (unsigned)(ctx.nbTrainSamples * ctx.accelParams.finalize / 100);
      const size_t dictionarySize = ZDICT_finalizeDictionary(
          dict, dictBufferCapacity, dict + tail, dictBufferCapacity - tail,
          samplesBuffer, samplesSizes, nbFinalizeSamples, coverParams.zParams);
      if (!ZSTD_isError(dictionarySize)) {
          DISPLAYLEVEL(2, "Constructed dictionary of size %u\n",
                      (unsigned)dictionarySize);
      }
      FASTCOVER_ctx_destroy(&ctx);
      free(segmentFreqs);
      return dictionarySize;
    }
}